

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_16_2_e751edba qclab::qgates::lambda_Hadamard<float>(Op op,float *vector)

{
  double dVar1;
  anon_class_16_2_e751edba aVar2;
  anon_class_16_2_e751edba f;
  R sqrt2;
  float *vector_local;
  Op op_local;
  
  dVar1 = std::sqrt(5.30498947741318e-315);
  aVar2.sqrt2 = 1.0 / SUB84(dVar1,0);
  aVar2.vector = vector;
  aVar2._12_4_ = 0;
  return aVar2;
}

Assistant:

auto lambda_Hadamard( Op op , T* vector ) {
    // operation
    using R = qclab::real_t< T > ;
    const R sqrt2 = R(1) / std::sqrt( R(2) ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      vector[a] = sqrt2 * x1 + sqrt2 * x2 ;
      vector[b] = sqrt2 * x1 - sqrt2 * x2 ;
    } ;
    return f ;
  }